

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

tjhandle tjInitDecompress(void)

{
  void *__s;
  long *in_FS_OFFSET;
  tjinstance *this;
  tjinstance *in_stack_ffffffffffffffe8;
  tjhandle local_8;
  
  __s = malloc(0x6d8);
  if (__s == (void *)0x0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"tjInitDecompress(): Memory allocation failure");
    local_8 = (tjhandle)0x0;
  }
  else {
    memset(__s,0,0x6d8);
    snprintf((char *)((long)__s + 0x608),200,"No error");
    local_8 = _tjInitDecompress(in_stack_ffffffffffffffe8);
  }
  return local_8;
}

Assistant:

DLLEXPORT tjhandle tjInitDecompress(void)
{
  tjinstance *this;

  if ((this = (tjinstance *)malloc(sizeof(tjinstance))) == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjInitDecompress(): Memory allocation failure");
    return NULL;
  }
  MEMZERO(this, sizeof(tjinstance));
  snprintf(this->errStr, JMSG_LENGTH_MAX, "No error");
  return _tjInitDecompress(this);
}